

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O2

void __thiscall
jaegertracing::Span::Span
          (Span *this,shared_ptr<const_jaegertracing::Tracer> *tracer,SpanContext *context,
          string *operationName,time_point *startTimeSystem,time_point *startTimeSteady,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *tags,
          vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *references)

{
  (this->super_Span)._vptr_Span = (_func_int **)&PTR__Span_002978e0;
  std::__shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_tracer).
              super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>,
             &tracer->super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>);
  SpanContext::SpanContext(&this->_context,context);
  std::__cxx11::string::string((string *)&this->_operationName,(string *)operationName);
  (this->_startTimeSystem).__d.__r = (startTimeSystem->__d).__r;
  (this->_startTimeSteady).__d.__r = (startTimeSteady->__d).__r;
  (this->_duration).__r = 0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&this->_tags,tags);
  (this->_logs).
  super__Vector_base<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_logs).
  super__Vector_base<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_logs).
  super__Vector_base<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::vector
            (&this->_references,references);
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  return;
}

Assistant:

explicit Span(
        const std::shared_ptr<const Tracer>& tracer = nullptr,
        const SpanContext& context = SpanContext(),
        const std::string& operationName = "",
        const SystemClock::time_point& startTimeSystem = SystemClock::now(),
        const SteadyClock::time_point& startTimeSteady = SteadyClock::now(),
        const std::vector<Tag>& tags = {},
        const std::vector<Reference>& references = {})
        : _tracer(tracer)
        , _context(context)
        , _operationName(operationName)
        , _startTimeSystem(startTimeSystem)
        , _startTimeSteady(startTimeSteady)
        , _duration()
        , _tags(tags)
        , _references(references)
    {
    }